

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

QPushButton * __thiscall
QDialogButtonBox::addButton(QDialogButtonBox *this,QString *text,ButtonRole role)

{
  uint in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QPushButton *button;
  QDialogButtonBoxPrivate *d;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar1;
  QWidget *local_30;
  char local_28 [12];
  AddRule in_stack_ffffffffffffffe4;
  LayoutRule in_stack_ffffffffffffffe8;
  ButtonRole in_stack_ffffffffffffffec;
  QAbstractButton *in_stack_fffffffffffffff0;
  QDialogButtonBoxPrivate *this_00;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  this_00 = *(QDialogButtonBoxPrivate **)(in_FS_OFFSET + 0x28);
  d_func((QDialogButtonBox *)0x66dd83);
  uVar1 = 8 < in_EDX;
  if ((bool)uVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),(char *)in_RDI,line,
               in_stack_ffffffffffffff88);
    QMessageLogger::warning
              (local_28,"QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
    local_30 = (QWidget *)0x0;
  }
  else {
    local_30 = (QWidget *)operator_new(0x28);
    QPushButton::QPushButton
              ((QPushButton *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),in_RDI,local_30);
    QDialogButtonBoxPrivate::addButton
              (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
               ,in_stack_ffffffffffffffe4);
  }
  if (*(QDialogButtonBoxPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return (QPushButton *)local_30;
  }
  __stack_chk_fail();
}

Assistant:

QPushButton *QDialogButtonBox::addButton(const QString &text, ButtonRole role)
{
    Q_D(QDialogButtonBox);
    if (Q_UNLIKELY(role <= InvalidRole || role >= NRoles)) {
        qWarning("QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
        return nullptr;
    }
    QPushButton *button = new QPushButton(text, this);
    d->addButton(button, role);
    return button;
}